

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

gs_expr_t * gs_parse_expr_assignment(gs_parser_t *parser)

{
  gs_token_t token_00;
  _Bool _Var1;
  gs_expr_t *right_00;
  gs_expr_t *right;
  gs_expr_t *expr;
  gs_token_t token;
  gs_parser_t *parser_local;
  
  token.field_3 = (anon_union_8_5_f029217d_for_gs_token_3)parser;
  gs_peek((gs_token_t *)&expr,parser);
  right = gs_parse_expr_comparison((gs_parser_t *)token.field_3.symbol);
  if ((token.field_3.symbol[0x1c] & 1U) == 0) {
    while ((_Var1 = gs_eat_char((gs_parser_t *)token.field_3.symbol,'='), _Var1 &&
           (right_00 = gs_parse_expr_assignment((gs_parser_t *)token.field_3.symbol),
           (token.field_3.symbol[0x1c] & 1U) == 0))) {
      token_00.col = token.type;
      token_00._12_4_ = token.line;
      token_00._0_8_ = expr;
      token_00.field_3 = (anon_union_8_5_f029217d_for_gs_token_3)token._8_8_;
      right = gs_expr_assignment_new((gs_parser_t *)token.field_3.symbol,token_00,right,right_00);
    }
  }
  return right;
}

Assistant:

static gs_expr_t *gs_parse_expr_assignment(gs_parser_t *parser) {
    gs_token_t token = gs_peek(parser);
    gs_expr_t *expr = gs_parse_expr_comparison(parser);
    if (parser->error) goto cleanup;

    while (true) {
        if (gs_eat_char(parser, '=')) {
            gs_expr_t *right = gs_parse_expr_assignment(parser);
            if (parser->error) goto cleanup;

            expr = gs_expr_assignment_new(parser, token, expr, right);
        }
        else {
            break;
        }
    }

cleanup:
    return expr;
}